

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O0

size_t fiobj_each2(FIOBJ o,_func_int_FIOBJ_void_ptr *task,void *arg)

{
  int iVar1;
  fiobj_object_vtable_s *pfVar2;
  _func_int_FIOBJ_void_ptr *local_80;
  task_packet_s packet;
  fiobj_stack_s stack;
  uintptr_t pos;
  void *arg_local;
  _func_int_FIOBJ_void_ptr *task_local;
  FIOBJ o_local;
  
  task_local = (_func_int_FIOBJ_void_ptr *)o;
  if ((((o == 0) || (o == 0)) || ((o & 1) != 0)) ||
     (((o & 6) == 6 ||
      (pfVar2 = fiobj_type_vtable(o),
      pfVar2->each == (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)))) {
    (*task)((FIOBJ)task_local,arg);
    o_local = 1;
  }
  else {
    iVar1 = (*task)((FIOBJ)task_local,arg);
    if (iVar1 == -1) {
      o_local = 1;
    }
    else {
      stack.arry = (FIOBJ *)0x0;
      memset(&packet.stop,0,0x20);
      packet.arg = &packet.stop;
      packet.stack = (fiobj_stack_s *)0x0;
      packet.next = 1;
      packet.counter._0_1_ = '\0';
      local_80 = task;
      packet.task = (_func_int_FIOBJ_void_ptr *)arg;
      do {
        if (stack.arry == (FIOBJ *)0x0) {
          packet.stack = (fiobj_stack_s *)0x0;
        }
        packet.counter._1_1_ = '\0';
        pfVar2 = fiobj_type_vtable((FIOBJ)task_local);
        stack.arry = (FIOBJ *)(*pfVar2->each)((FIOBJ)task_local,(size_t)stack.arry,
                                              fiobj_task_wrapper,&local_80);
        if ((char)packet.counter != '\0') break;
        if (packet.counter._1_1_ != '\0') {
          fiobj_stack_push((fiobj_stack_s *)&packet.stop,(FIOBJ)stack.arry);
          fiobj_stack_push((fiobj_stack_s *)&packet.stop,(FIOBJ)task_local);
        }
        if (packet.stack != (fiobj_stack_s *)0x0) {
          fiobj_stack_push((fiobj_stack_s *)&packet.stop,0);
          fiobj_stack_push((fiobj_stack_s *)&packet.stop,(FIOBJ)packet.stack);
        }
        task_local = (_func_int_FIOBJ_void_ptr *)0x0;
        fiobj_stack_pop((fiobj_stack_s *)&packet.stop,(FIOBJ *)&task_local);
        fiobj_stack_pop((fiobj_stack_s *)&packet.stop,(FIOBJ *)&stack.arry);
      } while (task_local != (_func_int_FIOBJ_void_ptr *)0x0);
      fiobj_stack_free((fiobj_stack_s *)&packet.stop);
      o_local = packet.next;
    }
  }
  return o_local;
}

Assistant:

size_t fiobj_each2(FIOBJ o, int (*task)(FIOBJ obj, void *arg), void *arg) {
  if (!o || !FIOBJ_IS_ALLOCATED(o) || (FIOBJECT2VTBL(o)->each == NULL)) {
    task(o, arg);
    return 1;
  }
  /* run task for root object */
  if (task(o, arg) == -1)
    return 1;
  uintptr_t pos = 0;
  fiobj_stack_s stack = FIO_ARY_INIT;
  struct task_packet_s packet = {
      .task = task,
      .arg = arg,
      .stack = &stack,
      .counter = 1,
  };
  do {
    if (!pos)
      packet.next = 0;
    packet.incomplete = 0;
    pos = FIOBJECT2VTBL(o)->each(o, pos, fiobj_task_wrapper, &packet);
    if (packet.stop)
      goto finish;
    if (packet.incomplete) {
      fiobj_stack_push(&stack, pos);
      fiobj_stack_push(&stack, o);
    }

    if (packet.next) {
      fiobj_stack_push(&stack, (FIOBJ)0);
      fiobj_stack_push(&stack, packet.next);
    }
    o = FIOBJ_INVALID;
    fiobj_stack_pop(&stack, &o);
    fiobj_stack_pop(&stack, &pos);
  } while (o);
finish:
  fiobj_stack_free(&stack);
  return packet.counter;
}